

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::rightJustified(QString *this,qsizetype width,QChar fill,bool truncate)

{
  long lVar1;
  qsizetype qVar2;
  char16_t *__src;
  char16_t in_CX;
  long in_RDX;
  QArrayDataPointer<char16_t> *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  QChar *uc;
  qsizetype padlen;
  qsizetype len;
  QString *result;
  QString *in_stack_ffffffffffffff68;
  QString *in_stack_ffffffffffffff70;
  QArrayDataPointer<char16_t> *n;
  char16_t *local_70;
  long local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  n = in_RDI;
  QString((QString *)0x5151cd);
  qVar2 = size((QString *)in_RSI);
  if (in_RDX - qVar2 < 1) {
    if ((in_R8B & 1) == 0) {
      operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    else {
      left((QString *)in_RSI,(qsizetype)n);
      operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      ~QString((QString *)0x5152de);
    }
  }
  else {
    resize(in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
    local_70 = QArrayDataPointer<char16_t>::data(in_RDI);
    local_58 = in_RDX - qVar2;
    while (local_58 != 0) {
      *local_70 = in_CX;
      local_70 = local_70 + 1;
      local_58 = local_58 + -1;
    }
    if (qVar2 != 0) {
      __src = QArrayDataPointer<char16_t>::data(in_RSI);
      memcpy(local_70,__src,qVar2 << 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)n;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::rightJustified(qsizetype width, QChar fill, bool truncate) const
{
    QString result;
    qsizetype len = size();
    qsizetype padlen = width - len;
    if (padlen > 0) {
        result.resize(len+padlen);
        QChar *uc = (QChar*)result.d.data();
        while (padlen--)
           * uc++ = fill;
        if (len)
          memcpy(static_cast<void *>(uc), static_cast<const void *>(d.data()), sizeof(QChar)*len);
    } else {
        if (truncate)
            result = left(width);
        else
            result = *this;
    }
    return result;
}